

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O2

int __thiscall jbcoin::sign(jbcoin *this,PublicKey *pk,SecretKey *sk,Slice *m)

{
  int iVar1;
  reference_const_type pKVar2;
  secp256k1_context *ctx;
  allocator local_1d9;
  size_t len;
  optional<jbcoin::KeyType> type;
  string local_1c8;
  uchar sig [72];
  result_type digest;
  secp256k1_ecdsa_signature sig_imp;
  sha512_half_hasher h;
  
  h.h_.ctx_._0_8_ = pk->buf_;
  h.h_.ctx_._8_8_ = pk->size_;
  type = publicKeyType((Slice *)&h);
  if (((ulong)type.super_type & 1) != 0) {
    pKVar2 = boost::optional<jbcoin::KeyType>::get(&type);
    if (*pKVar2 == secp256k1) {
      SHA512_Init((SHA512_CTX *)&h);
      openssl_sha512_hasher::operator()((openssl_sha512_hasher *)&h,m->data_,m->size_);
      detail::basic_sha512_half_hasher::operator_cast_to_base_uint
                (&digest,(basic_sha512_half_hasher *)&h);
      ctx = secp256k1Context<void>();
      iVar1 = secp256k1_ecdsa_sign
                        (ctx,&sig_imp,(uchar *)&digest,sk->buf_,nonce_function_rfc6979,(void *)0x0);
      if (iVar1 != 1) {
        std::__cxx11::string::string
                  ((string *)sig,"sign: secp256k1_ecdsa_sign failed",(allocator *)&local_1c8);
        LogicError((string *)sig);
      }
      len = 0x48;
      secp256k1Context<void>();
      iVar1 = secp256k1_ecdsa_signature_serialize_der(ctx,sig,&len,&sig_imp);
      if (iVar1 == 0) {
        std::__cxx11::string::string
                  ((string *)&local_1c8,"sign: secp256k1_ecdsa_signature_serialize_der failed",
                   &local_1d9);
        LogicError(&local_1c8);
      }
      Buffer::Buffer((Buffer *)this,sig,len);
    }
    else {
      if (*pKVar2 != ed25519) goto LAB_001d2b34;
      Buffer::Buffer((Buffer *)this,0x40);
      ed25519_sign(m->data_,m->size_,sk->buf_,pk->buf_ + 1,*(uchar **)this);
    }
    return (int)this;
  }
LAB_001d2b34:
  std::__cxx11::string::string((string *)&h,"sign: invalid type",(allocator *)sig);
  LogicError((string *)&h);
}

Assistant:

Buffer
sign (PublicKey const& pk,
    SecretKey const& sk, Slice const& m)
{
    auto const type =
        publicKeyType(pk.slice());
    if (! type)
        LogicError("sign: invalid type");
    switch(*type)
    {
    case KeyType::ed25519:
    {
        Buffer b(64);
        ed25519_sign(m.data(), m.size(),
            sk.data(), pk.data() + 1, b.data());
        return b;
    }
    case KeyType::secp256k1:
    {
        sha512_half_hasher h;
        h(m.data(), m.size());
        auto const digest =
            sha512_half_hasher::result_type(h);

        secp256k1_ecdsa_signature sig_imp;
        if(secp256k1_ecdsa_sign(
                secp256k1Context(),
                &sig_imp,
                reinterpret_cast<unsigned char const*>(
                    digest.data()),
                reinterpret_cast<unsigned char const*>(
                    sk.data()),
                secp256k1_nonce_function_rfc6979,
                nullptr) != 1)
            LogicError("sign: secp256k1_ecdsa_sign failed");

        unsigned char sig[72];
        size_t len = sizeof(sig);
        if(secp256k1_ecdsa_signature_serialize_der(
                secp256k1Context(),
                sig,
                &len,
                &sig_imp) != 1)
            LogicError("sign: secp256k1_ecdsa_signature_serialize_der failed");

        return Buffer{sig, len};
    }
    default:
        LogicError("sign: invalid type");
    }
}